

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O1

void cftmdl2(int n,double *a,double *w)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  double *pdVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  
  uVar9 = n >> 3;
  uVar4 = uVar9 * 2;
  dVar20 = w[1];
  uVar2 = uVar9 * 4;
  iVar1 = uVar9 * 4 + 1;
  dVar21 = *a - a[iVar1];
  dVar22 = a[1] + a[(int)uVar2];
  dVar18 = *a + a[iVar1];
  dVar17 = a[1] - a[(int)uVar2];
  iVar6 = uVar9 * 6 + 1;
  dVar25 = a[(int)uVar4] - a[iVar6];
  iVar3 = uVar9 * 2 + 1;
  dVar27 = a[iVar3] + a[(int)(uVar9 * 6)];
  dVar23 = a[(int)uVar4] + a[iVar6];
  dVar19 = a[iVar3] - a[(int)(uVar9 * 6)];
  dVar24 = (dVar25 - dVar27) * dVar20;
  dVar25 = (dVar27 + dVar25) * dVar20;
  *a = dVar21 + dVar24;
  a[1] = dVar22 + dVar25;
  a[(int)uVar4] = dVar21 - dVar24;
  a[iVar3] = dVar22 - dVar25;
  dVar21 = (dVar23 - dVar19) * dVar20;
  dVar20 = (dVar19 + dVar23) * dVar20;
  a[(int)uVar2] = dVar18 - dVar20;
  a[iVar1] = dVar17 + dVar21;
  a[(int)(uVar9 * 6)] = dVar20 + dVar18;
  a[iVar6] = dVar17 - dVar21;
  if (2 < (int)uVar9) {
    uVar5 = (ulong)uVar4;
    pdVar11 = w + ((ulong)uVar2 - 1);
    pdVar12 = w + 7;
    lVar7 = uVar5 - 1;
    lVar16 = uVar5 * 0x10 + -8;
    lVar13 = uVar5 * 0x18 + -8;
    lVar14 = uVar5 * 0x20 + -8;
    lVar10 = uVar5 + 3;
    lVar15 = uVar5 * 0x10 + 0x18;
    lVar8 = uVar5 * 0x18 + 0x18;
    uVar5 = 2;
    do {
      dVar20 = pdVar12[-3];
      dVar17 = pdVar12[-2];
      dVar18 = pdVar12[-1];
      dVar19 = *pdVar12;
      dVar21 = pdVar11[-3];
      dVar22 = pdVar11[-2];
      dVar23 = *(double *)((long)a + lVar15 + -8);
      dVar30 = a[uVar5] + *(double *)((long)a + lVar15);
      dVar27 = a[uVar5 + 1] - dVar23;
      dVar26 = a[uVar5] - *(double *)((long)a + lVar15);
      dVar24 = *(double *)((long)a + lVar8 + -8);
      dVar23 = a[uVar5 + 1] + dVar23;
      dVar25 = a[lVar10 + -1] - *(double *)((long)a + lVar8);
      dVar29 = a[lVar10 + -1] + *(double *)((long)a + lVar8);
      dVar28 = a[lVar10] - dVar24;
      dVar24 = a[lVar10] + dVar24;
      dVar31 = dVar20 * dVar26 - dVar23 * dVar17;
      dVar26 = dVar26 * dVar17 + dVar20 * dVar23;
      dVar33 = dVar22 * dVar25 - dVar24 * dVar21;
      dVar23 = pdVar11[-1];
      dVar25 = dVar25 * dVar21 + dVar22 * dVar24;
      dVar24 = *pdVar11;
      a[uVar5] = dVar31 + dVar33;
      dVar32 = dVar18 * dVar30 + dVar19 * dVar27;
      a[uVar5 + 1] = dVar26 + dVar25;
      dVar27 = dVar27 * dVar18 - dVar30 * dVar19;
      dVar30 = dVar24 * dVar29 + dVar23 * dVar28;
      a[lVar10 + -1] = dVar31 - dVar33;
      dVar28 = dVar28 * dVar24 - dVar29 * dVar23;
      a[lVar10] = dVar26 - dVar25;
      *(double *)((long)a + lVar15 + -8) = dVar32 + dVar30;
      *(double *)((long)a + lVar15) = dVar27 + dVar28;
      *(double *)((long)a + lVar8 + -8) = dVar32 - dVar30;
      *(double *)((long)a + lVar8) = dVar27 - dVar28;
      dVar25 = *(double *)((long)a + lVar13 + -8);
      dVar33 = a[lVar7 + -1] - *(double *)((long)a + lVar13);
      dVar30 = a[lVar7 + -1] + *(double *)((long)a + lVar13);
      dVar29 = a[lVar7] - dVar25;
      dVar27 = *(double *)((long)a + lVar14 + -8);
      dVar25 = a[lVar7] + dVar25;
      dVar26 = *(double *)((long)a + lVar16 + -8);
      dVar32 = dVar26 - *(double *)((long)a + lVar14);
      dVar26 = dVar26 + *(double *)((long)a + lVar14);
      dVar31 = *(double *)((long)a + lVar16) + dVar27;
      dVar27 = *(double *)((long)a + lVar16) - dVar27;
      dVar28 = dVar21 * dVar33 - dVar25 * dVar22;
      dVar22 = dVar25 * dVar21 + dVar33 * dVar22;
      dVar21 = dVar17 * dVar32 - dVar31 * dVar20;
      dVar20 = dVar31 * dVar17 + dVar32 * dVar20;
      a[lVar7 + -1] = dVar28 + dVar21;
      a[lVar7] = dVar22 + dVar20;
      *(double *)((long)a + lVar16 + -8) = dVar28 - dVar21;
      *(double *)((long)a + lVar16) = dVar22 - dVar20;
      dVar17 = dVar23 * dVar30 + dVar24 * dVar29;
      dVar21 = dVar29 * dVar23 - dVar30 * dVar24;
      dVar20 = dVar19 * dVar26 + dVar18 * dVar27;
      dVar18 = dVar27 * dVar19 - dVar26 * dVar18;
      *(double *)((long)a + lVar13 + -8) = dVar17 + dVar20;
      *(double *)((long)a + lVar13) = dVar21 + dVar18;
      *(double *)((long)a + lVar14 + -8) = dVar17 - dVar20;
      *(double *)((long)a + lVar14) = dVar21 - dVar18;
      pdVar11 = pdVar11 + -4;
      pdVar12 = pdVar12 + 4;
      uVar5 = uVar5 + 2;
      lVar7 = lVar7 + -2;
      lVar16 = lVar16 + -0x10;
      lVar13 = lVar13 + -0x10;
      lVar14 = lVar14 + -0x10;
      lVar10 = lVar10 + 2;
      lVar15 = lVar15 + 0x10;
      lVar8 = lVar8 + 0x10;
    } while (uVar5 < uVar9);
  }
  dVar20 = w[(int)uVar4];
  dVar17 = w[iVar3];
  lVar7 = (long)(int)(uVar9 * 5);
  dVar22 = a[(int)uVar9] - a[lVar7 + 1];
  dVar26 = a[(long)(int)uVar9 + 1] + a[lVar7];
  dVar18 = a[(int)uVar9] + a[lVar7 + 1];
  dVar21 = a[(long)(int)uVar9 + 1] - a[lVar7];
  lVar8 = (long)(int)(uVar9 * 3);
  lVar16 = (long)(int)(uVar9 * 7);
  dVar24 = a[lVar8] - a[lVar16 + 1];
  dVar25 = a[lVar8 + 1] + a[lVar16];
  dVar23 = a[lVar8] + a[lVar16 + 1];
  dVar19 = a[lVar8 + 1] - a[lVar16];
  dVar27 = dVar20 * dVar22 - dVar26 * dVar17;
  dVar22 = dVar22 * dVar17 + dVar20 * dVar26;
  dVar26 = dVar17 * dVar24 - dVar25 * dVar20;
  dVar24 = dVar24 * dVar20 + dVar17 * dVar25;
  a[(int)uVar9] = dVar27 + dVar26;
  a[(long)(int)uVar9 + 1] = dVar22 + dVar24;
  a[lVar8] = dVar27 - dVar26;
  a[lVar8 + 1] = dVar22 - dVar24;
  dVar22 = dVar17 * dVar18 - dVar21 * dVar20;
  dVar18 = dVar18 * dVar20 + dVar17 * dVar21;
  dVar21 = dVar20 * dVar23 - dVar19 * dVar17;
  dVar20 = dVar19 * dVar20 + dVar23 * dVar17;
  a[lVar7] = dVar22 - dVar21;
  a[lVar7 + 1] = dVar18 - dVar20;
  a[lVar16] = dVar21 + dVar22;
  a[lVar16 + 1] = dVar20 + dVar18;
  return;
}

Assistant:

void cftmdl2(int n, double *a, double *w) {
  int j, j0, j1, j2, j3, k, kr, m, mh;
  double wn4r, wk1r, wk1i, wk3r, wk3i, wd1r, wd1i, wd3r, wd3i;
  double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i, y0r, y0i, y2r, y2i;

  mh = n >> 3;
  m = 2 * mh;
  wn4r = w[1];
  j1 = m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[0] - a[j2 + 1];
  x0i = a[1] + a[j2];
  x1r = a[0] + a[j2 + 1];
  x1i = a[1] - a[j2];
  x2r = a[j1] - a[j3 + 1];
  x2i = a[j1 + 1] + a[j3];
  x3r = a[j1] + a[j3 + 1];
  x3i = a[j1 + 1] - a[j3];
  y0r = wn4r * (x2r - x2i);
  y0i = wn4r * (x2i + x2r);
  a[0] = x0r + y0r;
  a[1] = x0i + y0i;
  a[j1] = x0r - y0r;
  a[j1 + 1] = x0i - y0i;
  y0r = wn4r * (x3r - x3i);
  y0i = wn4r * (x3i + x3r);
  a[j2] = x1r - y0i;
  a[j2 + 1] = x1i + y0r;
  a[j3] = x1r + y0i;
  a[j3 + 1] = x1i - y0r;
  k = 0;
  kr = 2 * m;
  for (j = 2; j < mh; j += 2) {
    k += 4;
    wk1r = w[k];
    wk1i = w[k + 1];
    wk3r = w[k + 2];
    wk3i = w[k + 3];
    kr -= 4;
    wd1i = w[kr];
    wd1r = w[kr + 1];
    wd3i = w[kr + 2];
    wd3r = w[kr + 3];
    j1 = j + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j] - a[j2 + 1];
    x0i = a[j + 1] + a[j2];
    x1r = a[j] + a[j2 + 1];
    x1i = a[j + 1] - a[j2];
    x2r = a[j1] - a[j3 + 1];
    x2i = a[j1 + 1] + a[j3];
    x3r = a[j1] + a[j3 + 1];
    x3i = a[j1 + 1] - a[j3];
    y0r = wk1r * x0r - wk1i * x0i;
    y0i = wk1r * x0i + wk1i * x0r;
    y2r = wd1r * x2r - wd1i * x2i;
    y2i = wd1r * x2i + wd1i * x2r;
    a[j] = y0r + y2r;
    a[j + 1] = y0i + y2i;
    a[j1] = y0r - y2r;
    a[j1 + 1] = y0i - y2i;
    y0r = wk3r * x1r + wk3i * x1i;
    y0i = wk3r * x1i - wk3i * x1r;
    y2r = wd3r * x3r + wd3i * x3i;
    y2i = wd3r * x3i - wd3i * x3r;
    a[j2] = y0r + y2r;
    a[j2 + 1] = y0i + y2i;
    a[j3] = y0r - y2r;
    a[j3 + 1] = y0i - y2i;
    j0 = m - j;
    j1 = j0 + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j0] - a[j2 + 1];
    x0i = a[j0 + 1] + a[j2];
    x1r = a[j0] + a[j2 + 1];
    x1i = a[j0 + 1] - a[j2];
    x2r = a[j1] - a[j3 + 1];
    x2i = a[j1 + 1] + a[j3];
    x3r = a[j1] + a[j3 + 1];
    x3i = a[j1 + 1] - a[j3];
    y0r = wd1i * x0r - wd1r * x0i;
    y0i = wd1i * x0i + wd1r * x0r;
    y2r = wk1i * x2r - wk1r * x2i;
    y2i = wk1i * x2i + wk1r * x2r;
    a[j0] = y0r + y2r;
    a[j0 + 1] = y0i + y2i;
    a[j1] = y0r - y2r;
    a[j1 + 1] = y0i - y2i;
    y0r = wd3i * x1r + wd3r * x1i;
    y0i = wd3i * x1i - wd3r * x1r;
    y2r = wk3i * x3r + wk3r * x3i;
    y2i = wk3i * x3i - wk3r * x3r;
    a[j2] = y0r + y2r;
    a[j2 + 1] = y0i + y2i;
    a[j3] = y0r - y2r;
    a[j3 + 1] = y0i - y2i;
  }
  wk1r = w[m];
  wk1i = w[m + 1];
  j0 = mh;
  j1 = j0 + m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[j0] - a[j2 + 1];
  x0i = a[j0 + 1] + a[j2];
  x1r = a[j0] + a[j2 + 1];
  x1i = a[j0 + 1] - a[j2];
  x2r = a[j1] - a[j3 + 1];
  x2i = a[j1 + 1] + a[j3];
  x3r = a[j1] + a[j3 + 1];
  x3i = a[j1 + 1] - a[j3];
  y0r = wk1r * x0r - wk1i * x0i;
  y0i = wk1r * x0i + wk1i * x0r;
  y2r = wk1i * x2r - wk1r * x2i;
  y2i = wk1i * x2i + wk1r * x2r;
  a[j0] = y0r + y2r;
  a[j0 + 1] = y0i + y2i;
  a[j1] = y0r - y2r;
  a[j1 + 1] = y0i - y2i;
  y0r = wk1i * x1r - wk1r * x1i;
  y0i = wk1i * x1i + wk1r * x1r;
  y2r = wk1r * x3r - wk1i * x3i;
  y2i = wk1r * x3i + wk1i * x3r;
  a[j2] = y0r - y2r;
  a[j2 + 1] = y0i - y2i;
  a[j3] = y0r + y2r;
  a[j3 + 1] = y0i + y2i;
}